

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_return_stmt(SyntaxAnalyze *this)

{
  bool bVar1;
  SharedExNdPtr retValue;
  RightVal right;
  string tmpName;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> retStr;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  retStr.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  match_one_word(this,RETURNTK);
  bVar1 = try_word(this,1,SEMICN);
  if (!bVar1) {
    retValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    retValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    gm_exp((SyntaxAnalyze *)&right);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&retValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&right);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&right.
                       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_> + 8
               ));
    if ((retValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->_type == CNS) {
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&tmpName,&this->irGenerator,Int);
      right.
      super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._M_first.
      _M_storage = (_Uninitialized<int,_true>)0;
      right.
      super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
      std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
                ((variant<int,int,std::__cxx11::string> *)&right,
                 &(retValue.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_value);
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,std::__cxx11::string> *)&local_38,&tmpName);
      std::__detail::__variant::
      _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_60,
                        (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&right);
      irGenerator::irGenerator::ir_assign
                (&this->irGenerator,(LeftVal *)&local_38,(RightVal *)&local_60);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_60);
      std::__detail::__variant::
      _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage(&local_38);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&retStr,&tmpName);
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&right);
      std::__cxx11::string::~string((string *)&tmpName);
    }
    else {
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&retStr,
                 &(retValue.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&retValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  match_one_word(this,SEMICN);
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_88,
                   &retStr.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  irGenerator::irGenerator::ir_jump
            (&this->irGenerator,Return,-1,-1,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_88,Undefined);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_88);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&retStr);
  return;
}

Assistant:

void SyntaxAnalyze::gm_return_stmt() {
  std::optional<string> retStr;

  match_one_word(Token::RETURNTK);
  if (!try_word(1, Token::SEMICN)) {
    SharedExNdPtr retValue;

    retValue = gm_exp();

    if (retValue->_type == NodeType::CNS) {
      string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      RightVal right;
      right.emplace<0>(retValue->_value);
      irGenerator.ir_assign(tmpName, right);
      retStr = tmpName;
    } else {
      retStr = retValue->_name;
    }
  }
  match_one_word(Token::SEMICN);

  irGenerator.ir_jump(mir::inst::JumpInstructionKind::Return, -1, -1, retStr,
                      mir::inst::JumpKind::Undefined);
}